

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::UnitTest::PopGTestTrace(UnitTest *this)

{
  GTestMutexLock *in_RDI;
  MutexLock lock;
  MutexBase *in_stack_ffffffffffffffc8;
  
  internal::GTestMutexLock::GTestMutexLock(in_RDI,in_stack_ffffffffffffffc8);
  internal::UnitTestImpl::gtest_trace_stack((UnitTestImpl *)0x1a7eef);
  std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>::pop_back
            ((vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *)
             0x1a7f00);
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x1a7f0a);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  impl_->gtest_trace_stack().pop_back();
}